

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O1

void __thiscall
cmScriptGenerator::GenerateScriptActionsOnce(cmScriptGenerator *this,ostream *os,Indent *indent)

{
  ostream *poVar1;
  int iVar2;
  string config_test;
  string local_50;
  int local_2c;
  
  if ((this->Configurations).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Configurations).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    CreateConfigTest(&local_50,this,&this->Configurations);
    if (0 < indent->Level) {
      iVar2 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar2 = iVar2 + 1;
      } while (iVar2 < indent->Level);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
    local_2c = indent->Level + 2;
    (*this->_vptr_cmScriptGenerator[4])(this,os);
    if (0 < indent->Level) {
      iVar2 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar2 = iVar2 + 1;
      } while (iVar2 < indent->Level);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif(",6);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  (*this->_vptr_cmScriptGenerator[4])(this,os,indent);
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsOnce(std::ostream& os,
                                                  Indent const& indent)
{
  if(this->Configurations.empty())
    {
    // This rule is for all configurations.
    this->GenerateScriptActions(os, indent);
    }
  else
    {
    // Generate a per-configuration block.
    std::string config_test = this->CreateConfigTest(this->Configurations);
    os << indent << "if(" << config_test << ")\n";
    this->GenerateScriptActions(os, indent.Next());
    os << indent << "endif(" << config_test << ")\n";
    }
}